

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

unsigned_long file_size(fstream *file)

{
  long lVar1;
  long lVar2;
  
  lVar1 = std::istream::tellg();
  std::istream::seekg((long)file,_S_beg);
  lVar2 = std::istream::tellg();
  std::ios::clear((int)*(undefined8 *)(*(long *)file + -0x18) + (int)file);
  std::istream::seekg((long)file,_S_beg);
  return lVar2 - lVar1;
}

Assistant:

unsigned long file_size(fstream& file) {
    std::streampos fsize = 0;
    fsize = file.tellg();
    file.seekg( 0, std::ios::end);
    fsize = file.tellg() - fsize;
    file.clear();
    file.seekg( 0, std::ios::beg);
    return static_cast<unsigned long>(fsize);
}